

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlCountEqual(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  int local_38;
  int local_34;
  int Counter;
  int k;
  uint *pSimLo;
  uint *pSimLi;
  Aig_Obj_t *pObjLo_local;
  Aig_Obj_t *pObjLi_local;
  Ssw_Sml_t *p_local;
  
  local_38 = 0;
  if ((*(ulong *)&pObjLo->field_0x18 >> 3 & 1) == 0) {
    puVar2 = Ssw_ObjSim(p,pObjLi->Id);
    puVar3 = Ssw_ObjSim(p,pObjLo->Id);
    for (local_34 = p->nWordsPref; local_34 < p->nWordsTotal; local_34 = local_34 + 1) {
      iVar1 = Aig_WordCountOnes(puVar2[local_34] ^ puVar3[local_34] ^ 0xffffffff);
      local_38 = iVar1 + local_38;
    }
    return local_38;
  }
  __assert_fail("pObjLo->fPhase == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                ,0x112,"int Ssw_SmlCountEqual(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

int Ssw_SmlCountEqual( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo )
{
    unsigned * pSimLi, * pSimLo;
    int k, Counter = 0;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        Counter += Aig_WordCountOnes( ~(pSimLi[k] ^ pSimLo[k]) );
    return Counter;
}